

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceSwapFieldTest::FindFieldByName
          (NoFieldPresenceSwapFieldTest *this,string_view field_name)

{
  FieldDescriptor *v1;
  FieldDescriptor *v2;
  Nonnull<const_char_*> pcVar1;
  
  v1 = Descriptor::FindFieldByName(this->d1_,field_name);
  v2 = Descriptor::FindFieldByName(this->d2_,field_name);
  if (v1 == v2) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (v1,v2,"f1 == f2");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return v1;
  }
  protobuf::_GLOBAL__N_1::NoFieldPresenceSwapFieldTest::FindFieldByName();
}

Assistant:

const FieldDescriptor* FindFieldByName(absl::string_view field_name) {
    const FieldDescriptor* f1 = d1_->FindFieldByName(field_name);
    const FieldDescriptor* f2 = d2_->FindFieldByName(field_name);

    // We actually ensure uniqueness of *field descriptors* even if we try to
    // obtain them from different *message descriptors*.
    ABSL_CHECK_EQ(f1, f2);
    return f1;
  }